

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeval.c
# Opt level: O2

time_t curlx_tvdiff(timeval newer,timeval older)

{
  return (newer.tv_usec - older.tv_usec) / 1000 + (newer.tv_sec - older.tv_sec) * 1000;
}

Assistant:

time_t curlx_tvdiff(struct timeval newer, struct timeval older)
{
#if SIZEOF_TIME_T < 8
  /* for 32bit time_t systems, add a precaution to avoid overflow for really
     big time differences */
  time_t diff = newer.tv_sec-older.tv_sec;
  if(diff >= (0x7fffffff/1000))
    return 0x7fffffff;
#endif
  return (newer.tv_sec-older.tv_sec)*1000+
    (time_t)(newer.tv_usec-older.tv_usec)/1000;
}